

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRFakeHandTrackerDevice.cpp
# Opt level: O0

void __thiscall
MinVR::VRFakeHandTrackerDevice::appendNewInputEventsSinceLastCall
          (VRFakeHandTrackerDevice *this,VRDataQueue *inputEvents)

{
  VRDataQueue *in_RSI;
  VRDataQueue *in_RDI;
  VRDataQueue *in_stack_00000018;
  VRDataQueue *in_stack_00000020;
  
  VRDataQueue::VRDataQueue(in_RSI,in_RDI);
  VRDataQueue::addQueue(in_stack_00000020,in_stack_00000018);
  VRDataQueue::~VRDataQueue((VRDataQueue *)0x181732);
  VRDataQueue::clear((VRDataQueue *)0x181742);
  return;
}

Assistant:

void VRFakeHandTrackerDevice::appendNewInputEventsSinceLastCall(VRDataQueue* inputEvents)
{
    inputEvents->addQueue(_pendingEvents);
    _pendingEvents.clear();
}